

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O1

void __thiscall
handlegraph::MutablePathHandleGraph::pop_front_step
          (MutablePathHandleGraph *this,path_handle_t *path_handle)

{
  step_handle_t next;
  step_handle_t begin;
  undefined1 local_40 [16];
  undefined1 local_30 [32];
  
  local_40 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xe8))
                       (&this->field_0x0 + *(long *)(*(long *)this + -0x168));
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0x118))
            (&this->field_0x0 + *(long *)(*(long *)this + -0x168),local_40);
  (**(code **)(*(long *)this + 0x188))(local_30,this,local_40);
  return;
}

Assistant:

void MutablePathHandleGraph::pop_front_step(const path_handle_t& path_handle) {
    step_handle_t begin = path_begin(path_handle);
    step_handle_t next = get_next_step(begin);
    rewrite_segment(begin, next, std::vector<handle_t>());
}